

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

bool __thiscall testing::internal::FilePath::CreateFolder(FilePath *this)

{
  int iVar1;
  FilePath *path;
  bool bVar2;
  StatStruct file_stat;
  stat local_a0;
  
  iVar1 = mkdir((this->pathname_)._M_dataplus._M_p,0x1ff);
  bVar2 = true;
  if (iVar1 == -1) {
    memset(&local_a0,0,0x90);
    iVar1 = stat((this->pathname_)._M_dataplus._M_p,&local_a0);
    bVar2 = (local_a0.st_mode & 0xf000) == 0x4000 && iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool FilePath::CreateFolder() const {
#ifdef GTEST_OS_WINDOWS_MOBILE
  FilePath removed_sep(this->RemoveTrailingPathSeparator());
  LPCWSTR unicode = String::AnsiToUtf16(removed_sep.c_str());
  int result = CreateDirectory(unicode, nullptr) ? 0 : -1;
  delete[] unicode;
#elif defined(GTEST_OS_WINDOWS)
  int result = _mkdir(pathname_.c_str());
#elif defined(GTEST_OS_ESP8266) || defined(GTEST_OS_XTENSA) || \
    defined(GTEST_OS_QURT) || defined(GTEST_OS_NXP_QN9090) ||  \
    defined(GTEST_OS_NRF52)
  // do nothing
  int result = 0;
#else
  int result = mkdir(pathname_.c_str(), 0777);
#endif  // GTEST_OS_WINDOWS_MOBILE

  if (result == -1) {
    return this->DirectoryExists();  // An error is OK if the directory exists.
  }
  return true;  // No error.
}